

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_35081::OverheadTest_SmallBlocksLargerThanInitial_many_Test::TestBody
          (OverheadTest_SmallBlocksLargerThanInitial_many_Test *this)

{
  size_t size;
  uintptr_t uVar1;
  int iVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  OverheadTest test;
  char *in_stack_ffffffffffffff68;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  AssertHelper local_88;
  char in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  upb_Arena *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  
  OverheadTest::OverheadTest((OverheadTest *)&stack0xffffffffffffff90,0,0);
  uVar1 = upb_Arena_SpaceAllocated(in_stack_ffffffffffffff90,(size_t *)0x0);
  size = uVar1 * 2 + 1;
  iVar2 = 100;
  do {
    OverheadTest::Alloc((OverheadTest *)&stack0xffffffffffffff90,size);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  upb_Arena_SpaceAllocated(in_stack_ffffffffffffff90,(size_t *)0x0);
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffff68,(char *)0x16f26c,in_stack_ffffffffffffff98,
             (double)in_stack_ffffffffffffff90,(double)in_stack_ffffffffffffff88,
             (double)CONCAT71(in_stack_ffffffffffffff81,in_stack_ffffffffffffff80));
  if (in_stack_ffffffffffffff80 == '\0') {
    testing::Message::Message((Message *)&local_90);
    if (in_stack_ffffffffffffff88 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (in_stack_ffffffffffffff88->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena_test.cc"
               ,0x112,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffff88 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffff88,in_stack_ffffffffffffff88);
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
              *)&stack0xffffffffffffff98);
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffff68,(char *)0x16f35c,in_stack_ffffffffffffff98,
             (double)in_stack_ffffffffffffff90,(double)in_stack_ffffffffffffff88,
             (double)CONCAT71(in_stack_ffffffffffffff81,in_stack_ffffffffffffff80));
  if (in_stack_ffffffffffffff80 == '\0') {
    testing::Message::Message((Message *)&local_90);
    if (in_stack_ffffffffffffff88 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (in_stack_ffffffffffffff88->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena_test.cc"
               ,0x113,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffff88 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffff88,in_stack_ffffffffffffff88);
  }
  iVar2 = 900;
  do {
    OverheadTest::Alloc((OverheadTest *)&stack0xffffffffffffff90,size);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  upb_Arena_SpaceAllocated(in_stack_ffffffffffffff90,(size_t *)0x0);
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffff68,(char *)0x16f480,in_stack_ffffffffffffff98,
             (double)in_stack_ffffffffffffff90,(double)in_stack_ffffffffffffff88,
             (double)CONCAT71(in_stack_ffffffffffffff81,in_stack_ffffffffffffff80));
  if (in_stack_ffffffffffffff80 == '\0') {
    testing::Message::Message((Message *)&local_90);
    if (in_stack_ffffffffffffff88 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (in_stack_ffffffffffffff88->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena_test.cc"
               ,0x11e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffff88 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffff88,in_stack_ffffffffffffff88);
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
              *)&stack0xffffffffffffff98);
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffff68,(char *)0x16f56b,in_stack_ffffffffffffff98,
             (double)in_stack_ffffffffffffff90,(double)in_stack_ffffffffffffff88,
             (double)CONCAT71(in_stack_ffffffffffffff81,in_stack_ffffffffffffff80));
  if (in_stack_ffffffffffffff80 == '\0') {
    testing::Message::Message((Message *)&local_90);
    if (in_stack_ffffffffffffff88 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (in_stack_ffffffffffffff88->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena_test.cc"
               ,0x11f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffff88 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffff88,in_stack_ffffffffffffff88);
  }
  OverheadTest::~OverheadTest((OverheadTest *)&stack0xffffffffffffff90);
  return;
}

Assistant:

TEST(OverheadTest, SmallBlocksLargerThanInitial_many) {
  OverheadTest test;
  size_t initial_block_size = upb_Arena_SpaceAllocated(test.arena_, nullptr);
  for (int i = 0; i < 100; i++) {
    test.Alloc(initial_block_size * 2 + 1);
  }
  if (!UPB_ASAN) {
#ifdef __ANDROID__
    EXPECT_NEAR(test.WastePct(), 0.09, 0.025);
    EXPECT_NEAR(test.AmortizedAlloc(), 0.12, 0.025);
#else
    EXPECT_NEAR(test.WastePct(), 0.12, 0.03);
    EXPECT_NEAR(test.AmortizedAlloc(), 0.08, 0.025);
#endif
  }
  for (int i = 0; i < 900; i++) {
    test.Alloc(initial_block_size * 2 + 1);
  }
  if (!UPB_ASAN) {
#ifdef __ANDROID__
    EXPECT_NEAR(test.WastePct(), 0.05, 0.03);
    EXPECT_NEAR(test.AmortizedAlloc(), 0.08, 0.025);
#else
    EXPECT_NEAR(test.WastePct(), 0.04, 0.025);
    EXPECT_NEAR(test.AmortizedAlloc(), 0.05, 0.025);
#endif
  }
}